

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O2

JSON_Value * json_value_init_string_with_len(char *string,size_t length)

{
  byte bVar1;
  char *string_00;
  JSON_Value *pJVar2;
  byte *pbVar3;
  
  if (string == (char *)0x0) {
    return (JSON_Value *)0x0;
  }
  pbVar3 = (byte *)string;
  while( true ) {
    if (string + length <= pbVar3) {
      string_00 = (char *)(*parson_malloc)(length + 1);
      if (string_00 != (char *)0x0) {
        string_00[length] = '\0';
        memcpy(string_00,string,length);
        pJVar2 = json_value_init_string_no_copy(string_00,length);
        if (pJVar2 != (JSON_Value *)0x0) {
          return pJVar2;
        }
        (*parson_free)(string_00);
      }
      return (JSON_Value *)0x0;
    }
    bVar1 = *pbVar3;
    if (0xf4 < bVar1) {
      return (JSON_Value *)0x0;
    }
    if ((bVar1 & 0xfe) == 0xc0) break;
    if ((bVar1 & 0xc0) == 0x80) {
      return (JSON_Value *)0x0;
    }
    if ((char)bVar1 < '\0') {
      return (JSON_Value *)0x0;
    }
    pbVar3 = pbVar3 + 1;
  }
  return (JSON_Value *)0x0;
}

Assistant:

JSON_Value * json_value_init_string_with_len(const char *string, size_t length) {
    char *copy = NULL;
    JSON_Value *value;
    if (string == NULL) {
        return NULL;
    }
    if (!is_valid_utf8(string, length)) {
        return NULL;
    }
    copy = parson_strndup(string, length);
    if (copy == NULL) {
        return NULL;
    }
    value = json_value_init_string_no_copy(copy, length);
    if (value == NULL) {
        parson_free(copy);
    }
    return value;
}